

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O2

void __thiscall Glucose::SimpSolver::cleanUpClauses(SimpSolver *this)

{
  uint uVar1;
  uint *puVar2;
  uint *puVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  
  OccLists<int,_Glucose::vec<unsigned_int>,_Glucose::SimpSolver::ClauseDeleted>::cleanAll
            (&this->occurs);
  puVar2 = (this->super_Solver).clauses.data;
  puVar3 = (this->super_Solver).ca.super_RegionAllocator<unsigned_int>.memory;
  iVar4 = 0;
  for (lVar5 = 0; lVar5 < (this->super_Solver).clauses.sz; lVar5 = lVar5 + 1) {
    uVar1 = puVar2[lVar5];
    if ((puVar3[uVar1] & 3) == 0) {
      lVar6 = (long)iVar4;
      iVar4 = iVar4 + 1;
      puVar2[lVar6] = uVar1;
    }
  }
  vec<unsigned_int>::shrink(&(this->super_Solver).clauses,(int)lVar5 - iVar4);
  return;
}

Assistant:

void SimpSolver::cleanUpClauses()
{
    occurs.cleanAll();
    int i,j;
    for (i = j = 0; i < clauses.size(); i++)
        if (ca[clauses[i]].mark() == 0)
            clauses[j++] = clauses[i];
    clauses.shrink(i - j);
}